

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::initialize(ForceManager *this)

{
  bool bVar1;
  int iVar2;
  Globals *pGVar3;
  reference pvVar4;
  size_t sVar5;
  void *pvVar6;
  long *in_RDI;
  RealType RVar7;
  SimInfo *in_stack_00000058;
  ZConstraintForceModifier *in_stack_00000060;
  ZConstraintForceModifier *zCons;
  LDForceModifier *langevinDynamicsFM;
  string ensembleParam;
  RestraintForceModifier *restraint;
  ThermoIntegrationForceModifier *thermoInt;
  Light *light;
  UniformGradient *eGrad;
  MagneticField *mField;
  UniformField *eField;
  ForceFieldOptions *fopts;
  string axis;
  SimInfo *in_stack_000002e8;
  LDForceModifier *in_stack_000002f0;
  InteractionManager *in_stack_00000a70;
  SimInfo *in_stack_00000b28;
  RestraintForceModifier *in_stack_00000b30;
  Globals *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd58;
  string *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd60;
  SelectionManager *this_01;
  SimInfo *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  size_type in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  SimInfo *in_stack_fffffffffffffd88;
  Light *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  SelectionEvaluator *in_stack_fffffffffffffda0;
  SimInfo *in_stack_fffffffffffffdb8;
  ThermoIntegrationForceModifier *in_stack_fffffffffffffdc0;
  SimInfo *in_stack_fffffffffffffdd0;
  errorStruct *peVar8;
  RNEMDParameters *in_stack_fffffffffffffe50;
  string local_180 [32];
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  locale local_140 [8];
  string local_138 [32];
  string local_118 [32];
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  undefined8 local_98;
  double *local_90;
  double *local_88;
  undefined8 local_80;
  double *local_78;
  double *local_70;
  ForceFieldOptions *local_68;
  locale local_50 [8];
  string local_48 [32];
  string local_28 [40];
  
  bVar1 = SimInfo::isTopologyDone((SimInfo *)in_RDI[3]);
  if (!bVar1) {
    SimInfo::update((SimInfo *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    InteractionManager::setSimInfo((InteractionManager *)in_RDI[5],(SimInfo *)in_RDI[3]);
    InteractionManager::initialize(in_stack_00000a70);
    *(undefined1 *)((long)in_RDI + 0xf) = 0;
    *(undefined1 *)(in_RDI + 2) = 0;
    (**(code **)(*in_RDI + 0x20))();
    SimInfo::prepareTopology(in_stack_fffffffffffffdd0);
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::getOutputParticlePotential((Globals *)0x1295d7);
    *(bool *)((long)in_RDI + 9) = bVar1;
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::getPrintHeatFlux((Globals *)0x1295f8);
    *(bool *)((long)in_RDI + 0xc) = bVar1;
    if ((*(byte *)((long)in_RDI + 0xc) & 1) != 0) {
      *(undefined1 *)((long)in_RDI + 9) = 1;
    }
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::getOutputElectricField((Globals *)0x129633);
    *(bool *)((long)in_RDI + 10) = bVar1;
    pGVar3 = SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    Globals::getRNEMDParameters(pGVar3);
    bVar1 = RNEMD::RNEMDParameters::requiresElectricField(in_stack_fffffffffffffe50);
    *(bool *)((long)in_RDI + 10) = (*(byte *)((long)in_RDI + 10) & 1) != 0 || bVar1;
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::getOutputSitePotential((Globals *)0x129694);
    *(bool *)((long)in_RDI + 0xb) = bVar1;
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::haveUseSurfaceTerm((Globals *)0x1296b5);
    if (bVar1) {
      SimInfo::getSimParams((SimInfo *)in_RDI[3]);
      bVar1 = Globals::getUseSurfaceTerm((Globals *)0x1296d7);
      if (bVar1) {
        bVar1 = SimInfo::usesElectrostaticAtoms((SimInfo *)in_RDI[3]);
        if (bVar1) {
          SimInfo::getSimParams((SimInfo *)in_RDI[3]);
          bVar1 = Globals::getUseSurfaceTerm((Globals *)0x129713);
          *(bool *)((long)in_RDI + 0xf) = bVar1;
          SimInfo::getSimParams((SimInfo *)in_RDI[3]);
          bVar1 = Globals::haveUseSlabGeometry((Globals *)0x129734);
          if (bVar1) {
            SimInfo::getSimParams((SimInfo *)in_RDI[3]);
            bVar1 = Globals::getUseSlabGeometry((Globals *)0x129756);
            *(bool *)(in_RDI + 2) = bVar1;
            SimInfo::getSimParams((SimInfo *)in_RDI[3]);
            Globals::getPrivilegedAxis_abi_cxx11_(in_stack_fffffffffffffd48);
            std::locale::locale(local_50);
            toUpperCopy<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd88,
                       (locale *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
            std::locale::~locale(local_50);
            std::__cxx11::string::~string(local_48);
            iVar2 = std::__cxx11::string::compare((char *)local_28);
            if (iVar2 == 0) {
              *(undefined4 *)((long)in_RDI + 0x14) = 0;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_28);
              if (iVar2 == 0) {
                *(undefined4 *)((long)in_RDI + 0x14) = 1;
              }
              else {
                *(undefined4 *)((long)in_RDI + 0x14) = 2;
              }
            }
            std::__cxx11::string::~string(local_28);
          }
        }
        else {
          snprintf(painCave.errMsg,2000,
                   "ForceManager::initialize : useSurfaceTerm was set true\n\tbut no electrostatic atoms are present. OpenMD will\n\tignore this setting.\n"
                  );
          painCave.isFatal = 0;
          painCave.severity = 2;
          simError();
        }
      }
    }
  }
  local_68 = ForceField::getForceFieldOptions((ForceField *)in_RDI[4]);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
            );
  local_70 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48);
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48);
  local_80 = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (double *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
            );
  local_88 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48);
  local_90 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd48);
  local_98 = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (double *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),0);
  *pvVar4 = 1.0;
  RVar7 = ForceFieldOptions::getvdw12scale((ForceFieldOptions *)0x1299fc);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),1);
  *pvVar4 = RVar7;
  RVar7 = ForceFieldOptions::getvdw13scale((ForceFieldOptions *)0x129a38);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),2);
  *pvVar4 = RVar7;
  RVar7 = ForceFieldOptions::getvdw14scale((ForceFieldOptions *)0x129a74);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),3);
  *pvVar4 = RVar7;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),0);
  *pvVar4 = 1.0;
  RVar7 = ForceFieldOptions::getelectrostatic12scale((ForceFieldOptions *)0x129ad4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),1);
  *pvVar4 = RVar7;
  RVar7 = ForceFieldOptions::getelectrostatic13scale((ForceFieldOptions *)0x129b10);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),2);
  *pvVar4 = RVar7;
  RVar7 = ForceFieldOptions::getelectrostatic14scale((ForceFieldOptions *)0x129b4c);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),3);
  *pvVar4 = RVar7;
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::haveUniformField((Globals *)0x129b97);
  if (bVar1) {
    pvVar6 = operator_new(0x38);
    UniformField::UniformField
              ((UniformField *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    local_a8 = pvVar6;
    local_a0 = pvVar6;
    std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
              ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (value_type *)in_stack_fffffffffffffd48);
  }
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::haveMagneticField((Globals *)0x129c4d);
  if (bVar1) {
    pvVar6 = operator_new(0x38);
    MagneticField::MagneticField
              ((MagneticField *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    local_b8 = pvVar6;
    local_b0 = pvVar6;
    std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
              ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (value_type *)in_stack_fffffffffffffd48);
  }
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::haveUniformGradientStrength((Globals *)0x129d03);
  if (!bVar1) {
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::haveUniformGradientDirection1((Globals *)0x129d20);
    if (!bVar1) {
      SimInfo::getSimParams((SimInfo *)in_RDI[3]);
      bVar1 = Globals::haveUniformGradientDirection2((Globals *)0x129d3d);
      if (!bVar1) goto LAB_00129dda;
    }
  }
  pvVar6 = operator_new(0xa8);
  UniformGradient::UniformGradient
            ((UniformGradient *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68);
  local_c8 = pvVar6;
  local_c0 = pvVar6;
  std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
            ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
             CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             (value_type *)in_stack_fffffffffffffd48);
LAB_00129dda:
  pGVar3 = SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  Globals::getLightParameters(pGVar3);
  bVar1 = Perturbations::LightParameters::getUseLight((LightParameters *)0x129dfb);
  if (bVar1) {
    pvVar6 = operator_new(0x120);
    Perturbations::Light::Light(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_d8 = pvVar6;
    local_d0 = pvVar6;
    std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
              ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (value_type *)in_stack_fffffffffffffd48);
  }
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::getUseThermodynamicIntegration((Globals *)0x129eb1);
  if (bVar1) {
    pvVar6 = operator_new(0xd0);
    ThermoIntegrationForceModifier::ThermoIntegrationForceModifier
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_e8 = pvVar6;
    local_e0 = pvVar6;
    std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
              ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (value_type *)in_stack_fffffffffffffd48);
  }
  else {
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    bVar1 = Globals::getUseRestraints((Globals *)0x129f6a);
    if (bVar1) {
      pvVar6 = operator_new(0xb8);
      RestraintForceModifier::RestraintForceModifier(in_stack_00000b30,in_stack_00000b28);
      local_f8 = pvVar6;
      local_f0 = pvVar6;
      std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
                ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 (value_type *)in_stack_fffffffffffffd48);
    }
  }
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  Globals::getEnsemble_abi_cxx11_(in_stack_fffffffffffffd48);
  std::locale::locale(local_140);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd88,
             (locale *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::locale::~locale(local_140);
  std::__cxx11::string::~string(local_138);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                          (char *)in_stack_fffffffffffffd48);
  if (((bVar1) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                               (char *)in_stack_fffffffffffffd48), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                              (char *)in_stack_fffffffffffffd48), bVar1)) {
    peVar8 = &painCave;
    snprintf(painCave.errMsg,2000,
             "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n\tPlease rebuild OpenMD with qhull enabled."
            );
    peVar8->severity = 1;
    peVar8->isFatal = 1;
    simError();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                            (char *)in_stack_fffffffffffffd48);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                                (char *)in_stack_fffffffffffffd48), bVar1)) {
      pvVar6 = operator_new(0x110);
      LDForceModifier::LDForceModifier(in_stack_000002f0,in_stack_000002e8);
      local_150 = pvVar6;
      local_148 = pvVar6;
      std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
                ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 (value_type *)in_stack_fffffffffffffd48);
    }
  }
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  sVar5 = Globals::getNZconsStamps((Globals *)0x12a2a0);
  if (sVar5 != 0) {
    in_stack_fffffffffffffda0 = (SelectionEvaluator *)in_RDI[3];
    SimInfo::getSimParams((SimInfo *)in_stack_fffffffffffffda0);
    in_stack_fffffffffffffd98 = (string *)Globals::getNZconsStamps((Globals *)0x12a2dd);
    SimInfo::setNZconstraint((SimInfo *)in_stack_fffffffffffffda0,(int)in_stack_fffffffffffffd98);
    pvVar6 = operator_new(0x110);
    ZConstraintForceModifier::ZConstraintForceModifier(in_stack_00000060,in_stack_00000058);
    local_160 = pvVar6;
    local_158 = pvVar6;
    std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::push_back
              ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (value_type *)in_stack_fffffffffffffd48);
  }
  pGVar3 = SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x12a3a7);
  *(bool *)((long)in_RDI + 0xe) = bVar1;
  (**(code **)(*(long *)in_RDI[6] + 0x18))();
  *(undefined1 *)(in_RDI + 0x44) = 0;
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::havePotentialSelection((Globals *)0x12a3f7);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x44) = 1;
    SimInfo::getSimParams((SimInfo *)in_RDI[3]);
    Globals::getPotentialSelection_abi_cxx11_(in_stack_fffffffffffffd48);
    this_01 = (SelectionManager *)(in_RDI + 0x45);
    this_00 = local_180;
    std::__cxx11::string::operator=((string *)this_01,this_00);
    std::__cxx11::string::~string(this_00);
    SelectionEvaluator::loadScriptString(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x62));
    if (!bVar1) {
      SelectionEvaluator::evaluate((SelectionEvaluator *)pGVar3);
      SelectionManager::setSelectionSet(this_01,(SelectionSet *)this_00);
      SelectionSet::~SelectionSet((SelectionSet *)0x12a4f7);
    }
  }
  *(undefined1 *)(in_RDI + 1) = 1;
  std::__cxx11::string::~string(local_118);
  return;
}

Assistant:

void ForceManager::initialize() {
    if (!info_->isTopologyDone()) {
      info_->update();
      interactionMan_->setSimInfo(info_);
      interactionMan_->initialize();

      useSurfaceTerm_  = false;  // default, can be set by Ewald or directly
      useSlabGeometry_ = false;

      //! We want to delay the cutoffs until after the interaction
      //! manager has set up the atom-atom interactions so that we can
      //! query them for suggested cutoff values
      setupCutoffs();

      info_->prepareTopology();

      doParticlePot_ = info_->getSimParams()->getOutputParticlePotential();
      doHeatFlux_    = info_->getSimParams()->getPrintHeatFlux();
      if (doHeatFlux_) doParticlePot_ = true;

      doElectricField_ = info_->getSimParams()->getOutputElectricField();
      doElectricField_ |=
          info_->getSimParams()->getRNEMDParameters()->requiresElectricField();
      doSitePotential_ = info_->getSimParams()->getOutputSitePotential();
      if (info_->getSimParams()->haveUseSurfaceTerm() &&
          info_->getSimParams()->getUseSurfaceTerm()) {
        if (info_->usesElectrostaticAtoms()) {
          useSurfaceTerm_ = info_->getSimParams()->getUseSurfaceTerm();
          if (info_->getSimParams()->haveUseSlabGeometry()) {
            useSlabGeometry_ = info_->getSimParams()->getUseSlabGeometry();

            string axis =
                toUpperCopy(info_->getSimParams()->getPrivilegedAxis());
            if (axis.compare("X") == 0)
              axis_ = 0;
            else if (axis.compare("Y") == 0)
              axis_ = 1;
            else
              axis_ = 2;
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::initialize : useSurfaceTerm was set true\n"
                   "\tbut no electrostatic atoms are present. OpenMD will\n"
                   "\tignore this setting.\n");
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
    }

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();

    //! Force fields can set options on how to scale van der Waals and
    //! electrostatic interactions for atoms connected via bonds, bends
    //! and torsions in this case the topological distance between
    //! atoms is:
    //! 0 = topologically unconnected
    //! 1 = bonded together
    //! 2 = connected via a bend
    //! 3 = connected via a torsion

    vdwScale_.reserve(4);
    fill(vdwScale_.begin(), vdwScale_.end(), 0.0);

    electrostaticScale_.reserve(4);
    fill(electrostaticScale_.begin(), electrostaticScale_.end(), 0.0);

    vdwScale_[0] = 1.0;
    vdwScale_[1] = fopts.getvdw12scale();
    vdwScale_[2] = fopts.getvdw13scale();
    vdwScale_[3] = fopts.getvdw14scale();

    electrostaticScale_[0] = 1.0;
    electrostaticScale_[1] = fopts.getelectrostatic12scale();
    electrostaticScale_[2] = fopts.getelectrostatic13scale();
    electrostaticScale_[3] = fopts.getelectrostatic14scale();

    // Initialize the perturbations
    if (info_->getSimParams()->haveUniformField()) {
      UniformField* eField = new UniformField(info_);
      forceModifiers_.push_back(eField);
    }

    if (info_->getSimParams()->haveMagneticField()) {
      MagneticField* mField = new MagneticField(info_);
      forceModifiers_.push_back(mField);
    }

    if (info_->getSimParams()->haveUniformGradientStrength() ||
        info_->getSimParams()->haveUniformGradientDirection1() ||
        info_->getSimParams()->haveUniformGradientDirection2()) {
      UniformGradient* eGrad = new UniformGradient(info_);
      forceModifiers_.push_back(eGrad);
    }

    if (info_->getSimParams()->getLightParameters()->getUseLight()) {
      Perturbations::Light* light = new Perturbations::Light(info_);
      forceModifiers_.push_back(light);
    }

    // Initialize the force modifiers (order matters)
    if (info_->getSimParams()->getUseThermodynamicIntegration()) {
      ThermoIntegrationForceModifier* thermoInt =
          new ThermoIntegrationForceModifier(info_);
      forceModifiers_.push_back(thermoInt);
    } else if (info_->getSimParams()->getUseRestraints()) {
      RestraintForceModifier* restraint = new RestraintForceModifier(info_);
      forceModifiers_.push_back(restraint);
    }

    std::string ensembleParam =
        toUpperCopy(info_->getSimParams()->getEnsemble());

    if (ensembleParam == "LHULL" || ensembleParam == "LANGEVINHULL" ||
        ensembleParam == "SMIPD") {
#if defined(HAVE_QHULL)
      LangevinHullForceModifier* langevinHullFM =
          new LangevinHullForceModifier(info_);
      forceModifiers_.push_back(langevinHullFM);
#else
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n"
          "\tPlease rebuild OpenMD with qhull enabled.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
#endif
    } else if (ensembleParam == "LANGEVINDYNAMICS" || ensembleParam == "LD") {
      LDForceModifier* langevinDynamicsFM = new LDForceModifier(info_);
      forceModifiers_.push_back(langevinDynamicsFM);
    }

    if (info_->getSimParams()->getNZconsStamps() > 0) {
      info_->setNZconstraint(info_->getSimParams()->getNZconsStamps());
      ZConstraintForceModifier* zCons = new ZConstraintForceModifier(info_);
      forceModifiers_.push_back(zCons);
    }

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    fDecomp_->distributeInitialData();

    doPotentialSelection_ = false;
    if (info_->getSimParams()->havePotentialSelection()) {
      doPotentialSelection_ = true;
      selectionScript_      = info_->getSimParams()->getPotentialSelection();
      evaluator_.loadScriptString(selectionScript_);
      if (!evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }

    initialized_ = true;
  }